

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOTemplate.cpp
# Opt level: O0

void __thiscall jbcoin::SOTemplate::push_back(SOTemplate *this,SOElement *r)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  SOElement local_28;
  SOElement *local_18;
  SOElement *r_local;
  SOTemplate *this_local;
  
  local_18 = r;
  r_local = (SOElement *)this;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->mIndex);
  if (bVar1) {
    iVar2 = SField::getNumFields();
    local_28._12_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->mIndex,(long)(iVar2 + 1),(value_type_conflict1 *)&local_28.field_0xc);
  }
  iVar2 = SField::getNum(local_18->e_field);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->mIndex);
  if (sVar3 <= (ulong)(long)iVar2) {
    __assert_fail("r.e_field.getNum () < mIndex.size ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/SOTemplate.cpp"
                  ,0x27,"void jbcoin::SOTemplate::push_back(const SOElement &)");
  }
  iVar2 = getIndex(this,local_18->e_field);
  if (iVar2 != -1) {
    __assert_fail("getIndex (r.e_field) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/SOTemplate.cpp"
                  ,0x2b,"void jbcoin::SOTemplate::push_back(const SOElement &)");
  }
  sVar3 = std::
          vector<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>,_std::allocator<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>_>_>
          ::size(&this->mTypes);
  iVar2 = SField::getNum(local_18->e_field);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->mIndex,(long)iVar2);
  *pvVar4 = (value_type)sVar3;
  std::make_unique<jbcoin::SOElement_const,jbcoin::SOElement_const&>(&local_28);
  std::
  vector<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>,_std::allocator<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>_>_>
  ::push_back(&this->mTypes,(value_type *)&local_28);
  std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>::
  ~unique_ptr((unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_> *)
              &local_28);
  return;
}

Assistant:

void SOTemplate::push_back (SOElement const& r)
{
    // Ensure there is the enough space in the index mapping
    // table for all possible fields.
    //
    if (mIndex.empty ())
    {
        // Unmapped indices will be set to -1
        //
        mIndex.resize (SField::getNumFields () + 1, -1);
    }

    // Make sure the field's index is in range
    //
    assert (r.e_field.getNum () < mIndex.size ());

    // Make sure that this field hasn't already been assigned
    //
    assert (getIndex (r.e_field) == -1);

    // Add the field to the index mapping table
    //
    mIndex [r.e_field.getNum ()] = mTypes.size ();

    // Append the new element.
    //
    mTypes.push_back (std::make_unique<SOElement const> (r));
}